

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md_display_driver.cpp
# Opt level: O0

void __thiscall MdDisplayDriver::display(MdDisplayDriver *this,Document *doc,ostream *output)

{
  size_t sVar1;
  Paragraph *pPVar2;
  undefined4 uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ostream *poVar7;
  void *this_00;
  BoldLineElement *local_110;
  UrlLineElement *local_100;
  long local_f0;
  ItalicLineElement *local_e0;
  string local_b8 [48];
  string local_88 [32];
  ulong local_68;
  size_t j;
  size_t i;
  long lStack_50;
  int olist1_index;
  UrlLineElement *url_le;
  BoldLineElement *bold_le;
  ItalicLineElement *italic_le;
  CodeLineElement *code_le;
  LineElement *l;
  Paragraph *p;
  ostream *output_local;
  Document *doc_local;
  MdDisplayDriver *this_local;
  
  l = (LineElement *)0x0;
  code_le = (CodeLineElement *)0x0;
  italic_le = (ItalicLineElement *)0x0;
  bold_le = (BoldLineElement *)0x0;
  url_le = (UrlLineElement *)0x0;
  lStack_50 = 0;
  i._4_4_ = 1;
  p = (Paragraph *)output;
  output_local = (ostream *)doc;
  doc_local = (Document *)this;
  for (j = 0; sVar1 = j, uVar5 = Document::size(), sVar1 < uVar5; j = j + 1) {
    l = (LineElement *)Document::operator[]((ulong)output_local);
    uVar3 = (**(code **)(*(long *)l + 8))();
    switch(uVar3) {
    case 1:
      std::operator<<((ostream *)p,"# ");
      break;
    case 2:
      std::operator<<((ostream *)p,"## ");
      break;
    case 3:
      std::operator<<((ostream *)p,"### ");
      break;
    default:
      break;
    case 7:
      poVar7 = (ostream *)std::ostream::operator<<(p,i._4_4_);
      std::operator<<(poVar7,") ");
      i._4_4_ = i._4_4_ + 1;
      break;
    case 8:
      std::operator<<((ostream *)p,"* ");
      break;
    case 9:
      std::operator<<((ostream *)p,"  * ");
      break;
    case 10:
      std::operator<<((ostream *)p,"> ");
      break;
    case 0xb:
      std::operator<<((ostream *)p,"    ");
    }
    for (local_68 = 0; uVar5 = local_68, uVar6 = Paragraph::size(), uVar5 < uVar6;
        local_68 = local_68 + 1) {
      code_le = (CodeLineElement *)Paragraph::operator[]((ulong)l);
      if (code_le == (CodeLineElement *)0x0) {
        local_e0 = (ItalicLineElement *)0x0;
      }
      else {
        local_e0 = (ItalicLineElement *)
                   __dynamic_cast(code_le,&LineElement::typeinfo,&CodeLineElement::typeinfo,0);
      }
      italic_le = local_e0;
      if (code_le == (CodeLineElement *)0x0) {
        local_f0 = 0;
      }
      else {
        local_f0 = __dynamic_cast(code_le,&LineElement::typeinfo,&UrlLineElement::typeinfo,0);
      }
      lStack_50 = local_f0;
      if (code_le == (CodeLineElement *)0x0) {
        local_100 = (UrlLineElement *)0x0;
      }
      else {
        local_100 = (UrlLineElement *)
                    __dynamic_cast(code_le,&LineElement::typeinfo,&BoldLineElement::typeinfo,0);
      }
      url_le = local_100;
      if (code_le == (CodeLineElement *)0x0) {
        local_110 = (BoldLineElement *)0x0;
      }
      else {
        local_110 = (BoldLineElement *)
                    __dynamic_cast(code_le,&LineElement::typeinfo,&ItalicLineElement::typeinfo,0);
      }
      bold_le = local_110;
      if ((italic_le == (ItalicLineElement *)0x0) ||
         (iVar4 = (**(code **)(*(long *)l + 8))(), iVar4 == 0xb)) {
        if (lStack_50 == 0) {
          if (url_le == (UrlLineElement *)0x0) {
            if (bold_le != (BoldLineElement *)0x0) {
              std::operator<<((ostream *)p,"*");
            }
          }
          else {
            std::operator<<((ostream *)p,"**");
          }
        }
        else {
          std::operator<<((ostream *)p,"[");
        }
      }
      else {
        std::operator<<((ostream *)p,"`");
      }
      pPVar2 = p;
      (**(code **)(*(long *)code_le + 0x10))();
      std::operator<<((ostream *)pPVar2,local_88);
      std::__cxx11::string::~string(local_88);
      if ((italic_le == (ItalicLineElement *)0x0) ||
         (iVar4 = (**(code **)(*(long *)l + 8))(), iVar4 == 0xb)) {
        if (lStack_50 == 0) {
          if (url_le == (UrlLineElement *)0x0) {
            if (bold_le != (BoldLineElement *)0x0) {
              std::operator<<((ostream *)p,"*");
            }
          }
          else {
            std::operator<<((ostream *)p,"**");
          }
        }
        else {
          poVar7 = std::operator<<((ostream *)p,"](");
          UrlLineElement::url_abi_cxx11_();
          poVar7 = std::operator<<(poVar7,local_b8);
          std::operator<<(poVar7,")");
          std::__cxx11::string::~string(local_b8);
        }
      }
      else {
        std::operator<<((ostream *)p,"`");
      }
    }
    iVar4 = (**(code **)(*(long *)l + 8))();
    if (iVar4 != 7) {
      i._4_4_ = 1;
    }
    this_00 = (void *)std::ostream::operator<<(p,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void MdDisplayDriver::display(Document * doc, ostream & output) {
	Paragraph *p(nullptr);
	LineElement *l(nullptr);
	CodeLineElement *code_le(nullptr);
	ItalicLineElement *italic_le(nullptr);
	BoldLineElement *bold_le(nullptr);
	UrlLineElement *url_le(nullptr);

	int olist1_index(1);

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];

		switch (p->level()) {
			case Paragraph::Level::Title1:
				output << "# ";
				break;
			case Paragraph::Level::Title2:
				output << "## ";
				break;
			case Paragraph::Level::Title3:
				output << "### ";
				break;
			case Paragraph::Level::UList1:
				output << "* ";
				break;
			case Paragraph::Level::UList2:
				output << "  * ";
				break;
			case Paragraph::Level::OList1:
				output << olist1_index << ") ";
				++olist1_index;
				break;
			case Paragraph::Level::Quote:
				output << "> ";
				break;
			case Paragraph::Level::Code:
				output << "    ";
				break;
			default:
				break;

		}
		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];
			
			code_le = dynamic_cast<CodeLineElement*>(l);
			url_le = dynamic_cast<UrlLineElement*>(l);
			bold_le = dynamic_cast<BoldLineElement*>(l);
			italic_le = dynamic_cast<ItalicLineElement*>(l);
			
			if (code_le and p->level() != Paragraph::Level::Code) {
				output << "`";
			} else if (url_le) {
				output << "[";
			} else if (bold_le) {
				output << "**";
			} else if (italic_le) {
				output << "*";
			}

			output << l->content();
			
			if (code_le and p->level() != Paragraph::Level::Code) {
				output << "`";
			} else if (url_le) {
				output << "](" << url_le->url() << ")";
			} else if (bold_le) {
				output << "**";
			} else if (italic_le) {
				output << "*";
			}
		}

		if (p->level() != Paragraph::Level::OList1) {
			olist1_index = 1;
		}

		output << endl << endl;
	}
}